

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# View.cpp
# Opt level: O1

void __thiscall sf::View::reset(View *this,FloatRect *rectangle)

{
  float fVar1;
  float fVar2;
  
  fVar1 = rectangle->width;
  (this->m_center).x = fVar1 * 0.5 + rectangle->left;
  fVar2 = rectangle->height;
  (this->m_center).y = fVar2 * 0.5 + rectangle->top;
  (this->m_size).x = fVar1;
  (this->m_size).y = fVar2;
  this->m_rotation = 0.0;
  this->m_transformUpdated = false;
  this->m_invTransformUpdated = false;
  return;
}

Assistant:

void View::reset(const FloatRect& rectangle)
{
    m_center.x = rectangle.left + rectangle.width / 2.f;
    m_center.y = rectangle.top + rectangle.height / 2.f;
    m_size.x   = rectangle.width;
    m_size.y   = rectangle.height;
    m_rotation = 0;

    m_transformUpdated    = false;
    m_invTransformUpdated = false;
}